

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::AssertionPrinter::printReconstructedExpression(AssertionPrinter *this)

{
  bool bVar1;
  ostream *poVar2;
  TextAttributes local_b8;
  Text local_98;
  string local_40;
  Colour local_19 [8];
  Colour colourGuard;
  
  bVar1 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar1) {
    std::operator<<(this->stream,"with expansion:\n");
    local_19[0].m_moved = false;
    Colour::use(ReconstructedExpression);
    poVar2 = this->stream;
    std::__cxx11::string::string((string *)&local_40,(string *)&this->result->m_resultData);
    local_b8.initialIndent = 0xffffffffffffffff;
    local_b8.width = 0x4f;
    local_b8.tabChar = '\t';
    local_b8.indent = 2;
    Tbc::Text::Text(&local_98,&local_40,&local_b8);
    poVar2 = Tbc::operator<<(poVar2,&local_98);
    std::operator<<(poVar2,"\n");
    Tbc::Text::~Text(&local_98);
    std::__cxx11::string::~string((string *)&local_40);
    Colour::~Colour(local_19);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
                if( result.hasExpandedExpression() ) {
                    stream << "with expansion:\n";
                    Colour colourGuard( Colour::ReconstructedExpression );
                    stream << Text( result.getExpandedExpression(), TextAttributes().setIndent(2) ) << "\n";
                }
            }